

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathCompleteGraphsBenchmark.cpp
# Opt level: O2

double __thiscall
PathCompleteGraphsBenchmark::getDeletionsTime
          (PathCompleteGraphsBenchmark *this,unsigned_long deletions)

{
  DynamicGraph *this_00;
  _Base_ptr p_Var1;
  _Rb_tree_node_base *p_Var2;
  clock_t cVar3;
  clock_t cVar4;
  DynamicGraph *pDVar5;
  pointer peVar6;
  unsigned_long uVar7;
  vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  edges;
  _Vector_base<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  local_68;
  unsigned_long local_50;
  edge_desc_impl<boost::undirected_tag,_unsigned_long> local_48;
  
  local_68._M_impl.super__Vector_impl_data._M_start =
       (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish =
       (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_Benchmark).G;
  pDVar5 = this_00;
  uVar7 = deletions;
  do {
    pDVar5 = *(DynamicGraph **)
              &(pDVar5->super_UndirectedGraph).super_type.m_edges.
               super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
               ._M_impl._M_node.super__List_node_base;
    if (pDVar5 == this_00) break;
    local_48.m_eproperty =
         &(pDVar5->super_UndirectedGraph).super_type.m_vertices.
          super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
          ._M_impl.super__Vector_impl_data._M_finish;
    local_48.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
         (pDVar5->super_UndirectedGraph).super_type.m_edges.
         super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
         ._M_impl._M_node._M_size;
    local_48.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target =
         (unsigned_long)
         (pDVar5->super_UndirectedGraph).super_type.m_vertices.
         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
         ._M_impl.super__Vector_impl_data._M_start;
    std::
    vector<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>
    ::emplace_back<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>
              ((vector<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>
                *)&local_68,&local_48);
    uVar7 = uVar7 - 1;
  } while (uVar7 != 0);
  std::
  random_shuffle<__gnu_cxx::__normal_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>*,std::vector<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>>>
            ((__normal_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_*,_std::vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>_>
              )local_68._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_*,_std::vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>_>
              )local_68._M_impl.super__Vector_impl_data._M_finish);
  if (deletions != 0) {
    for (p_Var2 = (this->deletionSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->deletionSet)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      (local_68._M_impl.super__Vector_impl_data._M_start)->m_eproperty = p_Var2[1]._M_left;
      p_Var1 = p_Var2[1]._M_parent;
      ((local_68._M_impl.super__Vector_impl_data._M_start)->
      super_edge_base<boost::undirected_tag,_unsigned_long>).m_source =
           *(unsigned_long *)(p_Var2 + 1);
      ((local_68._M_impl.super__Vector_impl_data._M_start)->
      super_edge_base<boost::undirected_tag,_unsigned_long>).m_target = (unsigned_long)p_Var1;
    }
  }
  cVar3 = clock();
  for (peVar6 = local_68._M_impl.super__Vector_impl_data._M_start;
      peVar6 != local_68._M_impl.super__Vector_impl_data._M_finish; peVar6 = peVar6 + 1) {
    local_48.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
         (peVar6->super_edge_base<boost::undirected_tag,_unsigned_long>).m_source;
    local_50 = (peVar6->super_edge_base<boost::undirected_tag,_unsigned_long>).m_target;
    DynamicGraph::deleteEdge(this_00,(Vertex *)&local_48,&local_50);
  }
  cVar4 = clock();
  std::
  _Vector_base<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  ::~_Vector_base(&local_68);
  return (double)(cVar4 - cVar3) / 1000000.0;
}

Assistant:

double PathCompleteGraphsBenchmark::getDeletionsTime(unsigned long deletions)
{
    int deletionsCount = 0;
    std::vector<Edge> edges;

    EdgeIterator ei, ei_end;
    for(boost::tie(ei, ei_end) = boost::edges(G); ei != ei_end; ++ei) {
        edges.push_back(*ei);
        deletionsCount++;
        if (deletionsCount==deletions) {
            break;
        }
    }

    std::random_shuffle(edges.begin(), edges.end());

    // put the edges connecting the complete subgraphs at the beginning
    int counter = 0;
    for (auto i=this->deletionSet.begin(); i!=this->deletionSet.end(); ++i) {
        if (counter>=deletions) break;
        edges[counter] = *i;
    }

    clock_t begin = clock();
    for(auto e = edges.begin(); e!=edges.end(); ++e) {
        G.deleteEdge(boost::source(*e, G), boost::target(*e, G));
    }
    clock_t end = clock();
    double elapsed_secs = double(end-begin) / CLOCKS_PER_SEC;
    return elapsed_secs;
}